

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool value;
  TimeInMillis local_f0;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TestCase *local_18;
  TestCase *test_case_local;
  StreamingListener *this_local;
  
  local_18 = test_case;
  test_case_local = (TestCase *)this;
  value = TestCase::Passed(test_case);
  FormatBool_abi_cxx11_(&local_b8,this,value);
  std::operator+(&local_98,"event=TestCaseEnd&passed=",&local_b8);
  std::operator+(&local_78,&local_98,"&elapsed_time=");
  local_f0 = TestCase::elapsed_time(local_18);
  StreamableToString<long_long>(&local_e8,&local_f0);
  std::operator+(&local_58,&local_78,&local_e8);
  std::operator+(&local_38,&local_58,"ms");
  SendLn(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    SendLn("event=TestCaseEnd&passed=" + FormatBool(test_case.Passed())
           + "&elapsed_time=" + StreamableToString(test_case.elapsed_time())
           + "ms");
  }